

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompMultiplicativeExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  bool bVar1;
  int local_14;
  int op1;
  int op;
  xmlXPathParserContextPtr ctxt_local;
  
  xmlXPathCompUnaryExpr(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != '*') &&
         ((((*ctxt->cur != 'd' || (ctxt->cur[1] != 'i')) || (bVar1 = true, ctxt->cur[2] != 'v')) &&
          ((bVar1 = false, *ctxt->cur == 'm' && (bVar1 = false, ctxt->cur[1] == 'o')))))) {
        bVar1 = ctxt->cur[2] == 'd';
      }
      if (!bVar1) break;
      local_14 = -1;
      ch1 = ctxt->comp->last;
      if (*ctxt->cur == '*') {
        local_14 = 0;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      else if (*ctxt->cur == 'd') {
        local_14 = 1;
        ctxt->cur = ctxt->cur + 3;
      }
      else if (*ctxt->cur == 'm') {
        local_14 = 2;
        ctxt->cur = ctxt->cur + 3;
      }
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompUnaryExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_MULT,local_14,0,0,(void *)0x0,
                          (void *)0x0);
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompMultiplicativeExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompUnaryExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '*') ||
           ((CUR == 'd') && (NXT(1) == 'i') && (NXT(2) == 'v')) ||
           ((CUR == 'm') && (NXT(1) == 'o') && (NXT(2) == 'd'))) {
	int op = -1;
	int op1 = ctxt->comp->last;

        if (CUR == '*') {
	    op = 0;
	    NEXT;
	} else if (CUR == 'd') {
	    op = 1;
	    SKIP(3);
	} else if (CUR == 'm') {
	    op = 2;
	    SKIP(3);
	}
	SKIP_BLANKS;
        xmlXPathCompUnaryExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_MULT, op1, ctxt->comp->last, op, 0);
	SKIP_BLANKS;
    }
}